

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes-sw.c
# Opt level: O0

void aes_sw_setkey(ssh_cipher *ciph,void *vkey)

{
  aes_sw_context *ctx;
  void *vkey_local;
  ssh_cipher *ciph_local;
  
  aes_sliced_key_setup((aes_sliced_key *)(ciph + -0xa2),vkey,(long)ciph->vt->real_keybits);
  return;
}

Assistant:

static void aes_sw_setkey(ssh_cipher *ciph, const void *vkey)
{
    aes_sw_context *ctx = container_of(ciph, aes_sw_context, ciph);
    aes_sliced_key_setup(&ctx->sk, vkey, ctx->ciph.vt->real_keybits);
}